

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O0

Abc_Cex_t * Saig_ManExtendCex(Aig_Man_t *pAig,Abc_Cex_t *p)

{
  Vec_Ptr_t *p_00;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Abc_Cex_t *pAVar6;
  Aig_Obj_t *pAVar7;
  void *pvVar8;
  Aig_Obj_t *pAVar9;
  int local_48;
  int local_44;
  int iBit;
  int k;
  int i;
  int RetValue;
  Aig_Obj_t *pObjRo;
  Aig_Obj_t *pObjRi;
  Aig_Obj_t *pObj;
  Abc_Cex_t *pNew;
  Abc_Cex_t *p_local;
  Aig_Man_t *pAig_local;
  
  local_48 = 0;
  iVar3 = Aig_ManCiNum(pAig);
  pAVar6 = Abc_CexAlloc(0,iVar3,p->iFrame + 1);
  pAVar6->iPo = p->iPo;
  pAVar6->iFrame = p->iFrame;
  Aig_ManCleanMarkB(pAig);
  pAVar7 = Aig_ManConst1(pAig);
  *(ulong *)&pAVar7->field_0x18 = *(ulong *)&pAVar7->field_0x18 & 0xffffffffffffffdf | 0x20;
  for (iBit = 0; iVar3 = Saig_ManRegNum(pAig), iBit < iVar3; iBit = iBit + 1) {
    p_00 = pAig->vCis;
    iVar3 = Saig_ManPiNum(pAig);
    pvVar8 = Vec_PtrEntry(p_00,iBit + iVar3);
    uVar5 = Abc_InfoHasBit((uint *)(p + 1),local_48);
    *(ulong *)((long)pvVar8 + 0x18) =
         *(ulong *)((long)pvVar8 + 0x18) & 0xffffffffffffffdf | ((ulong)uVar5 & 1) << 5;
    local_48 = local_48 + 1;
  }
  for (iBit = 0; iBit <= p->iFrame; iBit = iBit + 1) {
    for (local_44 = 0; iVar3 = Saig_ManPiNum(pAig), local_44 < iVar3; local_44 = local_44 + 1) {
      pvVar8 = Vec_PtrEntry(pAig->vCis,local_44);
      uVar5 = Abc_InfoHasBit((uint *)(p + 1),local_48);
      *(ulong *)((long)pvVar8 + 0x18) =
           *(ulong *)((long)pvVar8 + 0x18) & 0xffffffffffffffdf | ((ulong)uVar5 & 1) << 5;
      local_48 = local_48 + 1;
    }
    for (local_44 = 0; iVar3 = Vec_PtrSize(pAig->vCis), local_44 < iVar3; local_44 = local_44 + 1) {
      pvVar8 = Vec_PtrEntry(pAig->vCis,local_44);
      if ((*(ulong *)((long)pvVar8 + 0x18) >> 5 & 1) != 0) {
        iVar3 = Aig_ManCiNum(pAig);
        Abc_InfoSetBit((uint *)(pAVar6 + 1),iVar3 * iBit + local_44);
      }
    }
    for (local_44 = 0; iVar3 = Vec_PtrSize(pAig->vObjs), local_44 < iVar3; local_44 = local_44 + 1)
    {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_44);
      if ((pAVar7 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar7), iVar3 != 0)) {
        pAVar9 = Aig_ObjFanin0(pAVar7);
        uVar2 = *(ulong *)&pAVar9->field_0x18;
        uVar5 = Aig_ObjFaninC0(pAVar7);
        pAVar9 = Aig_ObjFanin1(pAVar7);
        uVar1 = *(ulong *)&pAVar9->field_0x18;
        uVar4 = Aig_ObjFaninC1(pAVar7);
        *(ulong *)&pAVar7->field_0x18 =
             *(ulong *)&pAVar7->field_0x18 & 0xffffffffffffffdf |
             ((ulong)(((uint)(uVar2 >> 5) & 1 ^ uVar5) & ((uint)(uVar1 >> 5) & 1 ^ uVar4)) & 1) << 5
        ;
      }
    }
    for (local_44 = 0; iVar3 = Vec_PtrSize(pAig->vCos), local_44 < iVar3; local_44 = local_44 + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_44);
      pAVar9 = Aig_ObjFanin0(pAVar7);
      uVar2 = *(ulong *)&pAVar9->field_0x18;
      uVar5 = Aig_ObjFaninC0(pAVar7);
      *(ulong *)&pAVar7->field_0x18 =
           *(ulong *)&pAVar7->field_0x18 & 0xffffffffffffffdf |
           ((ulong)((uint)(uVar2 >> 5) & 1 ^ uVar5) & 1) << 5;
    }
    if (iBit == p->iFrame) break;
    for (local_44 = 0; iVar3 = Saig_ManRegNum(pAig), local_44 < iVar3; local_44 = local_44 + 1) {
      pAVar7 = Saig_ManLi(pAig,local_44);
      pAVar9 = Saig_ManLo(pAig,local_44);
      *(ulong *)&pAVar9->field_0x18 =
           *(ulong *)&pAVar9->field_0x18 & 0xffffffffffffffdf |
           (ulong)((uint)(*(ulong *)&pAVar7->field_0x18 >> 5) & 1) << 5;
    }
  }
  if (local_48 == p->nBits) {
    pAVar7 = Aig_ManCo(pAig,p->iPo);
    uVar2 = *(ulong *)&pAVar7->field_0x18;
    Aig_ManCleanMarkB(pAig);
    if ((uVar2 >> 5 & 1) == 0) {
      printf("Saig_ManExtendCex(): The counter-example is invalid!!!\n");
    }
    return pAVar6;
  }
  __assert_fail("iBit == p->nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDup.c"
                ,0x1a1,"Abc_Cex_t *Saig_ManExtendCex(Aig_Man_t *, Abc_Cex_t *)");
}

Assistant:

Abc_Cex_t * Saig_ManExtendCex( Aig_Man_t * pAig, Abc_Cex_t * p )
{
    Abc_Cex_t * pNew;
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    // create new counter-example
    pNew = Abc_CexAlloc( 0, Aig_ManCiNum(pAig), p->iFrame + 1 );
    pNew->iPo = p->iPo;
    pNew->iFrame = p->iFrame;
    // simulate the AIG
    Aig_ManCleanMarkB(pAig);
    Aig_ManConst1(pAig)->fMarkB = 1;
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Saig_ManForEachPi( pAig, pObj, k )
            pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
        ///////// write PI+LO values ////////////
        Aig_ManForEachCi( pAig, pObj, k )
            if ( pObj->fMarkB )
                Abc_InfoSetBit(pNew->pData, Aig_ManCiNum(pAig)*i + k);
        /////////////////////////////////////////
        Aig_ManForEachNode( pAig, pObj, k )
            pObj->fMarkB = (Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj)) & 
                           (Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj));
        Aig_ManForEachCo( pAig, pObj, k )
            pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMarkB = pObjRi->fMarkB;
    }
    assert( iBit == p->nBits );
    RetValue = Aig_ManCo(pAig, p->iPo)->fMarkB;
    Aig_ManCleanMarkB(pAig);
    if ( RetValue == 0 )
        printf( "Saig_ManExtendCex(): The counter-example is invalid!!!\n" );
    return pNew;
}